

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          FieldDescriptorProto *field,FileDescriptorProto *value)

{
  bool bVar1;
  int32_t value_00;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  LogFinisher local_c9;
  LogMessage local_c8;
  int32_t local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  FileDescriptorProto *local_30;
  FileDescriptorProto *value_local;
  FieldDescriptorProto *field_local;
  string *filename_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_30 = value;
  value_local = (FileDescriptorProto *)field;
  field_local = (FieldDescriptorProto *)filename;
  filename_local = (string *)this;
  FieldDescriptorProto::extendee_abi_cxx11_(field);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)value_local);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar3);
    if (*pcVar4 == '.') {
      psVar3 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)value_local);
      std::__cxx11::string::substr((ulong)&local_78,(ulong)psVar3);
      local_7c = FieldDescriptorProto::number((FieldDescriptorProto *)value_local);
      std::make_pair<std::__cxx11::string,int>(&local_58,&local_78,&local_7c);
      bVar1 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
                        (&this->by_extension_,&local_58,&local_30);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x115);
        pLVar5 = internal::LogMessage::operator<<
                           (&local_c8,
                            "Extension conflicts with extension already in database: extend ");
        psVar3 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)value_local);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar3);
        pLVar5 = internal::LogMessage::operator<<(pLVar5," { ");
        psVar3 = FieldDescriptorProto::name_abi_cxx11_((FieldDescriptorProto *)value_local);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar3);
        pLVar5 = internal::LogMessage::operator<<(pLVar5," = ");
        value_00 = FieldDescriptorProto::number((FieldDescriptorProto *)value_local);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,value_00);
        pLVar5 = internal::LogMessage::operator<<(pLVar5," } from:");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)field_local);
        internal::LogFinisher::operator=(&local_c9,pLVar5);
        internal::LogMessage::~LogMessage(&local_c8);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}